

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plan.cpp
# Opt level: O0

void __thiscall imrt::Plan::write_open_beamlets(Plan *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  reference ppSVar4;
  ostream *poVar5;
  void *pvVar6;
  reference pvVar7;
  reference piVar8;
  long in_RDI;
  int beam;
  iterator __end3;
  iterator __begin3;
  list<int,_std::allocator<int>_> *__range3;
  bool first;
  int i;
  set<int,_std::less<int>,_std::allocator<int>_> open_beamlets;
  Station *s_1;
  iterator __end1_1;
  iterator __begin1_1;
  list<imrt::Station_*,_std::allocator<imrt::Station_*>_> *__range1_1;
  int k;
  Station *s;
  iterator __end1;
  iterator __begin1;
  list<imrt::Station_*,_std::allocator<imrt::Station_*>_> *__range1;
  ofstream myfile;
  list<imrt::Station_*,_std::allocator<imrt::Station_*>_> *in_stack_fffffffffffffcb8;
  undefined4 in_stack_fffffffffffffcc0;
  int in_stack_fffffffffffffcc4;
  int in_stack_fffffffffffffd34;
  iterator in_stack_fffffffffffffd38;
  _Self local_2c0;
  undefined1 local_2b8 [24];
  undefined1 *local_2a0;
  byte local_295;
  int local_294;
  Station *local_260;
  _Self local_258;
  _Self local_250;
  long local_248;
  int local_23c;
  Station *local_238;
  _Self local_230;
  _Self local_228;
  long local_220;
  ostream local_208 [520];
  
  std::ofstream::ofstream(local_208);
  std::ofstream::open((char *)local_208,0x17a1ae);
  std::operator<<(local_208,"Angles\t");
  local_220 = in_RDI + 0x38;
  local_228._M_node =
       (_List_node_base *)
       std::__cxx11::list<imrt::Station_*,_std::allocator<imrt::Station_*>_>::begin
                 (in_stack_fffffffffffffcb8);
  local_230._M_node =
       (_List_node_base *)
       std::__cxx11::list<imrt::Station_*,_std::allocator<imrt::Station_*>_>::end
                 (in_stack_fffffffffffffcb8);
  while( true ) {
    bVar1 = std::operator!=(&local_228,&local_230);
    if (!bVar1) break;
    ppSVar4 = std::_List_iterator<imrt::Station_*>::operator*
                        ((_List_iterator<imrt::Station_*> *)
                         CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
    local_238 = *ppSVar4;
    iVar2 = Station::getAngle(local_238);
    poVar5 = (ostream *)std::ostream::operator<<(local_208,iVar2);
    std::operator<<(poVar5,"\t");
    std::_List_iterator<imrt::Station_*>::operator++(&local_228);
  }
  std::ostream::operator<<(local_208,std::endl<char,std::char_traits<char>>);
  local_23c = 0;
  local_248 = in_RDI + 0x38;
  local_250._M_node =
       (_List_node_base *)
       std::__cxx11::list<imrt::Station_*,_std::allocator<imrt::Station_*>_>::begin
                 (in_stack_fffffffffffffcb8);
  local_258._M_node =
       (_List_node_base *)
       std::__cxx11::list<imrt::Station_*,_std::allocator<imrt::Station_*>_>::end
                 (in_stack_fffffffffffffcb8);
  while( true ) {
    bVar1 = std::operator!=(&local_250,&local_258);
    if (!bVar1) break;
    ppSVar4 = std::_List_iterator<imrt::Station_*>::operator*
                        ((_List_iterator<imrt::Station_*> *)
                         CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
    local_260 = *ppSVar4;
    std::set<int,_std::less<int>,_std::allocator<int>_>::set
              ((set<int,_std::less<int>,_std::allocator<int>_> *)0x15bc77);
    poVar5 = (ostream *)std::ostream::operator<<(local_208,std::endl<char,std::char_traits<char>>);
    poVar5 = std::operator<<(poVar5,"Station Angle\t");
    iVar2 = Station::getAngle(local_260);
    pvVar6 = (void *)std::ostream::operator<<(poVar5,iVar2);
    std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
    local_294 = 0;
    while( true ) {
      iVar2 = local_294;
      iVar3 = Station::getNbApertures(local_260);
      if (iVar3 <= iVar2) break;
      poVar5 = std::operator<<(local_208,"Aperture\t");
      pvVar6 = (void *)std::ostream::operator<<(poVar5,local_294);
      std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
      poVar5 = std::operator<<(local_208,"Intensity\t");
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&local_260->intensity,(long)local_294);
      pvVar6 = (void *)std::ostream::operator<<(poVar5,*pvVar7);
      std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
      std::operator<<(local_208,"OpenBeamlets\t");
      local_295 = 1;
      Station::open_beamlets_abi_cxx11_
                ((Station *)in_stack_fffffffffffffd38._M_node,in_stack_fffffffffffffd34);
      local_2a0 = local_2b8;
      local_2c0._M_node =
           (_List_node_base *)
           std::__cxx11::list<int,_std::allocator<int>_>::begin
                     ((list<int,_std::allocator<int>_> *)in_stack_fffffffffffffcb8);
      in_stack_fffffffffffffd38 =
           std::__cxx11::list<int,_std::allocator<int>_>::end
                     ((list<int,_std::allocator<int>_> *)in_stack_fffffffffffffcb8);
      while( true ) {
        bVar1 = std::operator!=(&local_2c0,(_Self *)&stack0xfffffffffffffd38);
        if (!bVar1) break;
        piVar8 = std::_List_iterator<int>::operator*((_List_iterator<int> *)0x15be8a);
        in_stack_fffffffffffffd34 = *piVar8;
        if ((local_295 & 1) == 0) {
          std::operator<<(local_208,"\t");
        }
        local_295 = 0;
        std::ostream::operator<<(local_208,local_23c + in_stack_fffffffffffffd34);
        std::_List_iterator<int>::operator++(&local_2c0);
      }
      std::__cxx11::list<int,_std::allocator<int>_>::~list
                ((list<int,_std::allocator<int>_> *)0x15be5f);
      std::ostream::operator<<(local_208,std::endl<char,std::char_traits<char>>);
      local_294 = local_294 + 1;
    }
    in_stack_fffffffffffffcc4 = Station::getNbBeamlets((Station *)0x15bf4b);
    local_23c = in_stack_fffffffffffffcc4 + local_23c;
    std::set<int,_std::less<int>,_std::allocator<int>_>::~set
              ((set<int,_std::less<int>,_std::allocator<int>_> *)0x15bf70);
    std::_List_iterator<imrt::Station_*>::operator++(&local_250);
  }
  std::ofstream::close();
  std::ofstream::~ofstream(local_208);
  return;
}

Assistant:

void Plan::write_open_beamlets(){
    ofstream myfile;
    myfile.open ("openbeamlets.txt");

    myfile << "Angles\t";
    for(auto s:stations)
      myfile << s->getAngle() << "\t";
    myfile << endl;
    int k=0;
    for(auto s:stations){
      set<int> open_beamlets;
      myfile << endl << "Station Angle\t" << s->getAngle() << endl;
      for(int i=0; i<s->getNbApertures(); i++){
        myfile << "Aperture\t" << i << endl;
        myfile << "Intensity\t" << s->intensity[i] << endl;

        myfile << "OpenBeamlets\t" ;
        bool first=true;
        for(auto beam:s->open_beamlets(i)){
          if(!first) myfile << "\t";
          first=false;
          myfile << k+beam;
        }
        myfile << endl;
      }
      k+=s->getNbBeamlets();
    }
    myfile.close();

  }